

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.h
# Opt level: O0

void __thiscall fasttext::ProductQuantizer::ProductQuantizer(ProductQuantizer *this)

{
  byte *in_RDI;
  
  in_RDI[0] = 8;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *(int *)(in_RDI + 4) = 1 << (*in_RDI & 0x1f);
  in_RDI[8] = 0;
  in_RDI[9] = 1;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 8) * *(int *)(in_RDI + 4);
  in_RDI[0x10] = 0xd2;
  in_RDI[0x11] = 4;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0x19;
  in_RDI[0x15] = 0;
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  in_RDI[0x18] = 0x95;
  in_RDI[0x19] = 0xbf;
  in_RDI[0x1a] = 0xd6;
  in_RDI[0x1b] = 0x33;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x182fcf);
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)0x182fdd);
  return;
}

Assistant:

ProductQuantizer() {}